

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<vkb::SystemInfo> *
vkb::SystemInfo::get_system_info
          (Result<vkb::SystemInfo> *__return_storage_ptr__,
          PFN_vkGetInstanceProcAddr fp_vkGetInstanceProcAddr)

{
  bool bVar1;
  VulkanFunctions *this;
  error_code eVar2;
  SystemInfo local_60;
  uint local_28;
  error_category *local_20;
  PFN_vkGetInstanceProcAddr local_18;
  PFN_vkGetInstanceProcAddr fp_vkGetInstanceProcAddr_local;
  
  local_18 = fp_vkGetInstanceProcAddr;
  fp_vkGetInstanceProcAddr_local = (PFN_vkGetInstanceProcAddr)__return_storage_ptr__;
  this = detail::vulkan_functions();
  bVar1 = detail::VulkanFunctions::init_vulkan_funcs(this,local_18);
  if (bVar1) {
    SystemInfo(&local_60);
    Result<vkb::SystemInfo>::Result(__return_storage_ptr__,&local_60);
    ~SystemInfo(&local_60);
  }
  else {
    eVar2 = make_error_code(vulkan_unavailable);
    local_28 = eVar2._M_value;
    eVar2._4_4_ = 0;
    eVar2._M_value = local_28;
    local_20 = eVar2._M_cat;
    Result<vkb::SystemInfo>::Result(__return_storage_ptr__,eVar2,VK_SUCCESS);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<SystemInfo> SystemInfo::get_system_info(PFN_vkGetInstanceProcAddr fp_vkGetInstanceProcAddr) {
    // Using externally provided function pointers, assume the loader is available
    if (!detail::vulkan_functions().init_vulkan_funcs(fp_vkGetInstanceProcAddr)) {
        return make_error_code(InstanceError::vulkan_unavailable);
    }
    return SystemInfo();
}